

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O2

bool __thiscall pbrt::Atof(pbrt *this,string_view str,float *ptr)

{
  float fVar1;
  string local_28;
  
  local_28._M_dataplus._M_p = (pointer)&local_28.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_28,str._M_len,this + str._M_len);
  fVar1 = std::__cxx11::stof(&local_28,(size_t *)0x0);
  *(float *)str._M_str = fVar1;
  std::__cxx11::string::~string((string *)&local_28);
  return true;
}

Assistant:

bool Atof(std::string_view str, float *ptr) {
    try {
        *ptr = std::stof(std::string(str.begin(), str.end()));
    } catch (...) {
        return false;
    }
    return true;
}